

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

void call_return(ch_context *context)

{
  uint uVar1;
  ch_primitive *last;
  
  last = ch_stack_get(&context->stack,
                      (context->call_stack).calls[(context->call_stack).size - 1].stack_addr);
  close_upvalues(context,last);
  uVar1 = (context->call_stack).size - 1;
  (context->call_stack).size = uVar1;
  context->pcurrent = (context->call_stack).calls[uVar1].return_addr;
  ch_stack_seekto(&context->stack,(context->call_stack).calls[uVar1].stack_addr);
  return;
}

Assistant:

static void call_return(ch_context *context) {
  ch_primitive* stack_pos = ch_stack_get(&context->stack, CURRENT_CALL(context).stack_addr);
  close_upvalues(context, stack_pos);

  ch_call *call = &context->call_stack.calls[--context->call_stack.size];
  context->pcurrent = call->return_addr;

  // TODO check result of call
  ch_stack_seekto(&context->stack, call->stack_addr);
}